

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O2

void codegen(FILE *outfile)

{
  _node_t *node;
  symtbl_t *psVar1;
  
  node = ast_get_tree();
  if (node != (_node_t *)0x0) {
    f = outfile;
    fwrite(".org $C000 ; TMP BS\n",0x14,1,(FILE *)outfile);
    psVar1 = syms_get_table();
    export_syms(psVar1);
    fwrite(".org $200  ; TMP BS\n",0x14,1,(FILE *)f);
    psVar1 = syms_get_table();
    export_funcs(psVar1);
    gen_block(node);
    return;
  }
  return;
}

Assistant:

void codegen(FILE* outfile)
{
    _node_t* tree = ast_get_tree();
    if (!tree)
        return;

    f = outfile;

    fprintf(f, ".org $C000 ; TMP BS\n");
    export_syms(syms_get_table());

    fprintf(f, ".org $200  ; TMP BS\n");
    export_funcs(syms_get_table());
    gen_block(tree);
}